

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

bool __thiscall ELFIO::elfio::layout_segments_and_their_sections(elfio *this)

{
  elfio *peVar1;
  segment *seg;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  pointer ppsVar9;
  pointer ppsVar10;
  reference rVar11;
  Elf_Xword seg_start_pos;
  Elf_Xword segment_filesize;
  elfio *local_a0;
  Elf_Xword segment_memory;
  pointer local_80;
  vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> worklist;
  vector<bool,_std::allocator<bool>_> section_generated;
  undefined4 extraout_var_02;
  
  worklist.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  worklist.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  worklist.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar1 = (this->sections).parent;
  segment_memory = segment_memory & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&section_generated,
             (ulong)((uint)(*(int *)&(peVar1->sections_).
                                     super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(peVar1->sections_).
                                    super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff),
             (bool *)&segment_memory,(allocator_type *)&segment_filesize);
  get_ordered_segments
            ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)&segment_memory,this);
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::_M_move_assign
            (&worklist,
             (_Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)&segment_memory);
  std::_Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::~_Vector_base
            ((_Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)&segment_memory);
  local_80 = worklist.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppsVar9 = worklist.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_a0 = this;
  for (ppsVar10 = worklist.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppsVar10 != ppsVar9;
      ppsVar10 = ppsVar10 + 1) {
    seg = *ppsVar10;
    segment_memory = 0;
    segment_filesize = 0;
    seg_start_pos = this->current_file_pos;
    iVar4 = (*seg->_vptr_segment[3])(seg);
    if ((iVar4 == 6) && (iVar4 = (*seg->_vptr_segment[0x16])(seg), (short)iVar4 == 0)) {
      iVar4 = (*((this->header)._M_t.
                 super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                 .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
                [0x1e])();
      seg_start_pos = CONCAT44(extraout_var_00,iVar4);
      uVar5 = (*((this->header)._M_t.
                 super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                 .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
                [9])();
      uVar6 = (*((this->header)._M_t.
                 super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                 .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
                [0x1c])();
      segment_filesize = (ulong)(uVar6 & 0xffff) * (ulong)(uVar5 & 0xffff);
      segment_memory = segment_filesize;
    }
    else {
      iVar4 = (*seg->_vptr_segment[0x18])(seg);
      if (((char)iVar4 == '\0') ||
         (iVar4 = (*seg->_vptr_segment[0x11])(seg), CONCAT44(extraout_var,iVar4) != 0)) {
        iVar4 = (*seg->_vptr_segment[0x16])(seg);
        if ((short)iVar4 != 0) {
          uVar5 = (*seg->_vptr_segment[0x17])(seg,0);
          rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&section_generated,(ulong)(uVar5 & 0xffff));
          if ((*rVar11._M_p & rVar11._M_mask) == 0) {
            iVar4 = (*seg->_vptr_segment[7])(seg);
            uVar8 = 1;
            if (CONCAT44(extraout_var_01,iVar4) != 0) {
              iVar4 = (*seg->_vptr_segment[7])(seg);
              uVar8 = CONCAT44(extraout_var_02,iVar4);
            }
            uVar2 = local_a0->current_file_pos;
            iVar4 = (*seg->_vptr_segment[9])(seg);
            iVar7 = (*seg->_vptr_segment[7])(seg);
            seg_start_pos =
                 ((CONCAT44(extraout_var_03,iVar4) % uVar8 + CONCAT44(extraout_var_04,iVar7)) -
                 uVar2 % uVar8) % uVar8 + local_a0->current_file_pos;
            local_a0->current_file_pos = seg_start_pos;
            ppsVar9 = local_80;
            this = local_a0;
            goto LAB_0010749a;
          }
        }
        iVar4 = (*seg->_vptr_segment[0x16])(seg);
        if ((short)iVar4 != 0) {
          uVar5 = (*seg->_vptr_segment[0x17])(seg,0);
          seg_start_pos =
               (**(code **)(*(long *)(((this->sections).parent)->sections_).
                                     super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar5 & 0xffff]._M_t.
                                     super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                           + 0xb8))();
        }
      }
      else {
        seg_start_pos = 0;
        iVar4 = (*seg->_vptr_segment[0x16])(seg);
        if ((short)iVar4 != 0) {
          segment_filesize = this->current_file_pos;
          segment_memory = segment_filesize;
        }
      }
    }
LAB_0010749a:
    bVar3 = write_segment_data(this,seg,&section_generated,&segment_memory,&segment_filesize,
                               &seg_start_pos);
    if (!bVar3) break;
    (*seg->_vptr_segment[0xe])(seg,&segment_filesize);
    iVar4 = (*seg->_vptr_segment[0xf])(seg);
    if (CONCAT44(extraout_var_05,iVar4) < segment_memory) {
      (*seg->_vptr_segment[0x10])
                (seg,(_Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)
                     &segment_memory);
    }
    (*seg->_vptr_segment[0x19])(seg);
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&section_generated.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::~_Vector_base
            (&worklist.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>);
  return ppsVar10 == ppsVar9;
}

Assistant:

bool layout_segments_and_their_sections()
    {
        std::vector<segment*> worklist;
        std::vector<bool>     section_generated( sections.size(), false );

        // Get segments in a order in where segments which contain a
        // sub sequence of other segments are located at the end
        worklist = get_ordered_segments();

        for ( auto* seg : worklist ) {
            Elf_Xword segment_memory   = 0;
            Elf_Xword segment_filesize = 0;
            Elf_Xword seg_start_pos    = current_file_pos;
            // Special case: PHDR segment
            // This segment contains the program headers but no sections
            if ( seg->get_type() == PT_PHDR && seg->get_sections_num() == 0 ) {
                seg_start_pos  = header->get_segments_offset();
                segment_memory = segment_filesize =
                    header->get_segment_entry_size() *
                    static_cast<Elf_Xword>( header->get_segments_num() );
            }
            // Special case:
            else if ( seg->is_offset_initialized() && seg->get_offset() == 0 ) {
                seg_start_pos = 0;
                if ( seg->get_sections_num() > 0 ) {
                    segment_memory = segment_filesize = current_file_pos;
                }
            }
            // New segments with not generated sections
            // have to be aligned
            else if ( seg->get_sections_num() > 0 &&
                      !section_generated[seg->get_section_index_at( 0 )] ) {
                Elf_Xword align = seg->get_align() > 0 ? seg->get_align() : 1;
                Elf64_Off cur_page_alignment = current_file_pos % align;
                Elf64_Off req_page_alignment =
                    seg->get_virtual_address() % align;
                Elf64_Off adjustment = req_page_alignment - cur_page_alignment;

                current_file_pos += ( seg->get_align() + adjustment ) % align;
                seg_start_pos = current_file_pos;
            }
            else if ( seg->get_sections_num() > 0 ) {
                seg_start_pos =
                    sections[seg->get_section_index_at( 0 )]->get_offset();
            }

            // Write segment's data
            if ( !write_segment_data( seg, section_generated, segment_memory,
                                      segment_filesize, seg_start_pos ) ) {
                return false;
            }

            seg->set_file_size( segment_filesize );

            // If we already have a memory size from loading an elf file (value > 0),
            // it must not shrink!
            // Memory size may be bigger than file size and it is the loader's job to do something
            // with the surplus bytes in memory, like initializing them with a defined value.
            if ( seg->get_memory_size() < segment_memory ) {
                seg->set_memory_size( segment_memory );
            }

            seg->set_offset( seg_start_pos );
        }

        return true;
    }